

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O0

int SUNLinSolSetup_SPTFQMR(SUNLinearSolver S,SUNMatrix A)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  void *PData;
  PSetupFn Psetup;
  int ier;
  SUNMatrix A_local;
  SUNLinearSolver S_local;
  
  if (S == (SUNLinearSolver)0x0) {
    S_local._4_4_ = -1;
  }
  else {
    pcVar1 = *(code **)((long)S->content + 0x30);
    if ((pcVar1 == (code *)0x0) ||
       (iVar2 = (*pcVar1)(*(undefined8 *)((long)S->content + 0x40)), iVar2 == 0)) {
      S_local._4_4_ = 0;
    }
    else {
      iVar3 = 4;
      if (iVar2 < 0) {
        iVar3 = -5;
      }
      *(long *)((long)S->content + 0x18) = (long)iVar3;
      S_local._4_4_ = (int)*(undefined8 *)((long)S->content + 0x18);
    }
  }
  return S_local._4_4_;
}

Assistant:

int SUNLinSolSetup_SPTFQMR(SUNLinearSolver S, SUNMatrix A)
{
  int ier;
  PSetupFn Psetup;
  void* PData;

  /* Set shortcuts to SPTFQMR memory structures */
  if (S == NULL) return(SUNLS_MEM_NULL);
  Psetup = SPTFQMR_CONTENT(S)->Psetup;
  PData = SPTFQMR_CONTENT(S)->PData;
  
  /* no solver-specific setup is required, but if user-supplied 
     Psetup routine exists, call that here */
  if (Psetup != NULL) {
    ier = Psetup(PData);
    if (ier != 0) {
      LASTFLAG(S) = (ier < 0) ? 
	SUNLS_PSET_FAIL_UNREC : SUNLS_PSET_FAIL_REC;
      return(LASTFLAG(S));
    }
  }
  
  /* return with success */ 
  return(SUNLS_SUCCESS);
}